

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

int __thiscall Saturation::SaturationAlgorithm::init(SaturationAlgorithm *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  undefined4 extraout_var;
  Stack<Kernel::Clause_*> *a;
  ClauseIterator toAdd;
  VirtualIterator<Kernel::Clause_*> local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [8];
  Clause **ppCStack_70;
  Clause **local_68;
  Entry *pEStack_60;
  VirtualIterator<Kernel::Clause_*> local_50;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>
  local_48;
  
  local_88._core = (IteratorCore<Kernel::Clause_*> *)0x0;
  if (*(char *)(Lib::env + 0x16b2) == '\x01') {
    local_68 = (Clause **)0x0;
    pEStack_60 = (Entry *)0x0;
    local_78 = (undefined1  [8])0x0;
    ppCStack_70 = (Clause **)0x0;
    Kernel::Problem::clauseIterator((Problem *)local_80);
    Lib::Stack<Kernel::Clause*>::loadFromIterator<Lib::VirtualIterator<Kernel::Clause*>>
              ((Stack<Kernel::Clause*> *)local_78,(VirtualIterator<Kernel::Clause_*> *)local_80);
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
              ((VirtualIterator<Kernel::Clause_*> *)local_80);
    Shell::Shuffling::shuffleArray<Lib::Stack<Kernel::Clause*>>
              ((Stack<Kernel::Clause_*> *)local_78,
               (uint)((ulong)((long)local_68 - (long)ppCStack_70) >> 3));
    Lib::arrayIter<Lib::Stack<Kernel::Clause*>>(&local_48,(Lib *)local_78,a);
    Lib::
    pvi<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>>
              ((Lib *)&local_50,&local_48);
    Lib::VirtualIterator<Kernel::Clause_*>::operator=(&local_88,&local_50);
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&local_50);
    Lib::Stack<Kernel::Clause_*>::~Stack((Stack<Kernel::Clause_*> *)&local_48);
    Lib::Stack<Kernel::Clause_*>::~Stack((Stack<Kernel::Clause_*> *)local_78);
  }
  else {
    Kernel::Problem::clauseIterator((Problem *)local_78);
    Lib::VirtualIterator<Kernel::Clause_*>::operator=
              (&local_88,(VirtualIterator<Kernel::Clause_*> *)local_78);
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
              ((VirtualIterator<Kernel::Clause_*> *)local_78);
  }
  while( true ) {
    iVar1 = (*(local_88._core)->_vptr_IteratorCore[2])();
    if ((char)iVar1 == '\0') break;
    iVar1 = (*(local_88._core)->_vptr_IteratorCore[3])();
    addInputClause(this,(Clause *)CONCAT44(extraout_var,iVar1));
  }
  if (this->_splitter != (Splitter *)0x0) {
    Splitter::init(this->_splitter,(EVP_PKEY_CTX *)this);
  }
  if (this->_consFinder != (ConsequenceFinder *)0x0) {
    ConsequenceFinder::init(this->_consFinder,(EVP_PKEY_CTX *)this);
  }
  if (this->_symEl != (SymElOutput *)0x0) {
    SymElOutput::init(this->_symEl,(EVP_PKEY_CTX *)this);
  }
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&local_88);
  return extraout_EAX;
}

Assistant:

void SaturationAlgorithm::init()
{
  ClauseIterator toAdd;

  if (env.options->randomTraversals()) {
    TIME_TRACE(TimeTrace::SHUFFLING);

    Stack<Clause *> aux;
    aux.loadFromIterator(_prb.clauseIterator());
    Shuffling::shuffleArray(aux,aux.size());
    toAdd = pvi(arrayIter(std::move(aux)));
  } else {
    toAdd = _prb.clauseIterator();
  }

  while (toAdd.hasNext()) {
    Clause* cl = toAdd.next();
    addInputClause(cl);
  }

  if (_splitter) {
    _splitter->init(this);
  }
  if (_consFinder) {
    _consFinder->init(this);
  }
  if (_symEl) {
    _symEl->init(this);
  }
}